

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O0

ScenarioLowerBound * __thiscall
despot::SimpleRockSample::CreateScenarioLowerBound
          (SimpleRockSample *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  TrivialParticleLowerBound *this_00;
  ScenarioLowerBound *this_01;
  ParticleLowerBound *bound_00;
  ostream *poVar2;
  string local_58 [48];
  ScenarioLowerBound *local_28;
  ScenarioLowerBound *bound;
  string *particle_bound_name_local;
  string *name_local;
  SimpleRockSample *this_local;
  
  local_28 = (ScenarioLowerBound *)0x0;
  bound = (ScenarioLowerBound *)particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"TRIVIAL");
  if ((!bVar1) && (bVar1 = std::operator==(name,"DEFAULT"), !bVar1)) {
    bVar1 = std::operator==(name,"EAST");
    if (bVar1) {
      this_01 = (ScenarioLowerBound *)operator_new(0x20);
      std::__cxx11::string::string(local_58,(string *)particle_bound_name);
      bound_00 = (ParticleLowerBound *)(**(code **)(*(long *)this + 0x70))(this,local_58);
      SimpleRockSampleEastPolicy::SimpleRockSampleEastPolicy
                ((SimpleRockSampleEastPolicy *)this_01,&this->super_DSPOMDP,bound_00);
      local_28 = this_01;
      std::__cxx11::string::~string(local_58);
      return local_28;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound algorithm: ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  this_00 = (TrivialParticleLowerBound *)operator_new(0x10);
  despot::TrivialParticleLowerBound::TrivialParticleLowerBound(this_00,&this->super_DSPOMDP);
  return (ScenarioLowerBound *)this_00;
}

Assistant:

ScenarioLowerBound* SimpleRockSample::CreateScenarioLowerBound(string name,
	string particle_bound_name) const {
	ScenarioLowerBound* bound = NULL;
	if (name == "TRIVIAL" || name == "DEFAULT") {
		bound = new TrivialParticleLowerBound(this);
	} else if (name == "EAST") {
		bound = new SimpleRockSampleEastPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		cerr << "Unsupported lower bound algorithm: " << name << endl;
		exit(0);
	}
	return bound;
}